

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::PsbtSignatureData::~PsbtSignatureData(PsbtSignatureData *this)

{
  PsbtSignatureData *this_local;
  
  ~PsbtSignatureData(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PsbtSignatureData() {
    // do nothing
  }